

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::GetIntegerIntervalFunctions<duckdb::ToQuartersOperator>(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbdc;
  FunctionNullHandling in_stack_fffffffffffffbe8;
  allocator_type local_411;
  bind_lambda_function_t in_stack_fffffffffffffbf0;
  scalar_function_t local_3f8;
  scalar_function_t local_3d8;
  LogicalType local_3b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a0;
  LogicalType local_388;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_370;
  LogicalType local_358;
  LogicalType local_340;
  ScalarFunction local_328;
  ScalarFunction local_200;
  BaseScalarFunction local_d8;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbf0,INTEGER);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xfffffffffffffbf0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_370,__l,&local_411);
  LogicalType::LogicalType(&local_388,INTERVAL);
  local_3d8.super__Function_base._M_functor._8_8_ = 0;
  local_3d8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<int,duckdb::interval_t,duckdb::ToQuartersOperator>;
  local_3d8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3d8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_340,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_340;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffbd4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffbdc;
  ScalarFunction::ScalarFunction
            (&local_200,(vector<duckdb::LogicalType,_true> *)&local_370,&local_388,&local_3d8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_200);
  local_200.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_200.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_200.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_200.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_200.function.super__Function_base._M_manager)
              ((_Any_data *)&local_200.function,(_Any_data *)&local_200.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_200.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_340);
  if (local_3d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8,(_Any_data *)&local_3d8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_388);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_370);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbf0);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffffbf0,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&stack0xfffffffffffffbf0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a0,__l_00,&local_411);
  LogicalType::LogicalType(&local_3b8,INTERVAL);
  local_3f8.super__Function_base._M_functor._8_8_ = 0;
  local_3f8.super__Function_base._M_functor._M_unused._M_function_pointer =
       ScalarFunction::UnaryFunction<long,duckdb::interval_t,duckdb::ToQuartersOperator>;
  local_3f8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_3f8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_358,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_358;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffbd4;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffbdc;
  ScalarFunction::ScalarFunction
            (&local_328,(vector<duckdb::LogicalType,_true> *)&local_3a0,&local_3b8,&local_3f8,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_328);
  local_328.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_328.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_328.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_328.function.super__Function_base._M_manager)
              ((_Any_data *)&local_328.function,(_Any_data *)&local_328.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_328.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_358);
  if (local_3f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3f8.super__Function_base._M_manager)
              ((_Any_data *)&local_3f8,(_Any_data *)&local_3f8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_3b8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a0);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffffbf0);
  function = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_d8,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_d8);
      function = function + 1;
    } while (function != pSVar1);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet GetIntegerIntervalFunctions() {
	ScalarFunctionSet function_set;
	function_set.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int32_t, interval_t, OP>));
	function_set.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int64_t, interval_t, OP>));
	for (auto &func : function_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return function_set;
}